

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O0

adt_str_t * dtl_json_dumps(dtl_dv_t *dv,int32_t indent,_Bool sortKeys)

{
  undefined1 local_58 [8];
  dtl_json_writer_t writer;
  adt_str_t *retval;
  _Bool sortKeys_local;
  int32_t indent_local;
  dtl_dv_t *dv_local;
  
  writer.sortKeys = false;
  writer._49_7_ = 0;
  dtl_json_writer_createWithString((dtl_json_writer_t *)local_58);
  if (0 < indent) {
    dtl_json_writer_setIndentWidth((dtl_json_writer_t *)local_58,indent);
  }
  if (sortKeys) {
    dtl_json_writer_setSortKeys((dtl_json_writer_t *)local_58,true);
  }
  dtl_json_writer_write_dv((dtl_json_writer_t *)local_58,dv,true);
  writer._48_8_ = writer.destFile;
  dtl_json_writer_destroy((dtl_json_writer_t *)local_58,true);
  return (adt_str_t *)writer._48_8_;
}

Assistant:

adt_str_t* dtl_json_dumps(const dtl_dv_t *dv, int32_t indent, bool sortKeys)
{
   adt_str_t *retval = (adt_str_t*) 0;
   dtl_json_writer_t writer;
   dtl_json_writer_createWithString(&writer);
   if (indent > 0)
   {
      dtl_json_writer_setIndentWidth(&writer, indent);
   }
   if (sortKeys)
   {
      dtl_json_writer_setSortKeys(&writer, true);
   }
   dtl_json_writer_write_dv(&writer, dv, true);
   retval = writer.destStr;
   dtl_json_writer_destroy(&writer, true);
   return retval;
}